

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O0

Rep * __thiscall absl::lts_20240722::crc_internal::CrcCordState::mutable_rep(CrcCordState *this)

{
  int *piVar1;
  RefcountedRep *this_00;
  RefcountedRep *copy;
  CrcCordState *this_local;
  memory_order __b;
  
  piVar1 = *(int **)this;
  std::operator&(memory_order_acquire,__memory_order_mask);
  if (*piVar1 != 1) {
    this_00 = (RefcountedRep *)operator_new(0x68);
    RefcountedRep::RefcountedRep(this_00);
    Rep::operator=(&this_00->rep,(Rep *)(*(long *)this + 8));
    Unref(*(RefcountedRep **)this);
    *(RefcountedRep **)this = this_00;
  }
  return (Rep *)(*(long *)this + 8);
}

Assistant:

Rep* mutable_rep() {
    if (refcounted_rep_->count.load(std::memory_order_acquire) != 1) {
      RefcountedRep* copy = new RefcountedRep;
      copy->rep = refcounted_rep_->rep;
      Unref(refcounted_rep_);
      refcounted_rep_ = copy;
    }
    return &refcounted_rep_->rep;
  }